

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O2

void word_restore(t_word *wp,t_template *template,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  t_dataslot *ptVar2;
  ulong uVar3;
  ulong uVar4;
  t_float tVar5;
  
  ptVar2 = template->t_vec;
  uVar3 = 0;
  uVar4 = (ulong)(uint)template->t_n;
  if (template->t_n < 1) {
    uVar4 = uVar3;
  }
  for (; (int)uVar4 != (int)uVar3; uVar3 = uVar3 + 1) {
    if (ptVar2->ds_type == 1) {
      if (argc == 0) {
        argc = 0;
        ptVar1 = &s_;
      }
      else {
        ptVar1 = atom_getsymbol(argv);
        argv = argv + 1;
        argc = argc + -1;
      }
      wp[uVar3].w_symbol = ptVar1;
    }
    else if (ptVar2->ds_type == 0) {
      if (argc == 0) {
        tVar5 = 0.0;
        argc = 0;
      }
      else {
        tVar5 = atom_getfloat(argv);
        argv = argv + 1;
        argc = argc + -1;
      }
      wp[uVar3].w_float = tVar5;
    }
    ptVar2 = ptVar2 + 1;
  }
  if (argc != 0) {
    post("warning: word_restore: extra arguments");
    return;
  }
  return;
}

Assistant:

void word_restore(t_word *wp, t_template *template,
    int argc, t_atom *argv)
{
    int i, nitems = template->t_n;
    t_dataslot *datatypes = template->t_vec;
    for (i = 0; i < nitems; i++, datatypes++, wp++)
    {
        int type = datatypes->ds_type;
        if (type == DT_FLOAT)
        {
            t_float f;
            if (argc)
            {
                f =  atom_getfloat(argv);
                argv++, argc--;
            }
            else f = 0;
            wp->w_float = f;
        }
        else if (type == DT_SYMBOL)
        {
            t_symbol *s;
            if (argc)
            {
                s =  atom_getsymbol(argv);
                argv++, argc--;
            }
            else s = &s_;
            wp->w_symbol = s;
        }
    }
    if (argc)
        post("warning: word_restore: extra arguments");
}